

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

void check_call_unroll(jit_State *J,TraceNo lnk)

{
  uint uVar1;
  TValue *pTVar2;
  uint32_t uVar3;
  TValue *pTVar4;
  int iVar5;
  int iVar6;
  
  pTVar2 = J->L->base;
  pTVar4 = pTVar2 + -1;
  iVar5 = 0;
  for (iVar6 = (int)((char)(J->pt->flags << 6) >> 7) + J->framedepth; 0 < iVar6;
      iVar6 = (iVar6 - (uint)((uVar1 & 7) == 2)) + -1) {
    uVar1 = (pTVar4->field_2).it;
    if (((long)(int)uVar1 & 3U) == 0) {
      pTVar4 = pTVar4 + (-1 - (ulong)*(byte *)((ulong)uVar1 - 3));
    }
    else {
      pTVar4 = (TValue *)((long)pTVar4 - ((long)(int)uVar1 & 0xfffffffffffffff8U));
    }
    iVar5 = iVar5 + (uint)(*(int *)((ulong)(pTVar4->u32).lo + 0x10) ==
                          *(int *)((ulong)pTVar2[-1].u32.lo + 0x10));
  }
  if (J->pc == J->startpc) {
    if (J->param[0xc] < iVar5 + J->tailcalled) {
      J->pc = J->pc + 1;
      lj_record_stop(J,(J->framedepth + J->retdepth != 0) + LJ_TRLINK_TAILREC,(uint)(J->cur).traceno
                    );
      return;
    }
  }
  else if (J->param[0xb] < iVar5) {
    if (lnk != 0) {
      lj_trace_flush(J,lnk);
      uVar3 = J->prngstate * 0x41c64e6d + 0x3039;
      J->prngstate = uVar3;
      *(ushort *)((long)&J[1].cur.nextgc.gcptr32 + (ulong)(*(int *)&J->pc + 4U >> 1 & 0x7e)) =
           (ushort)(uVar3 >> 0x1c);
    }
    lj_trace_err(J,LJ_TRERR_CUNROLL);
  }
  return;
}

Assistant:

static void check_call_unroll(jit_State *J, TraceNo lnk)
{
  cTValue *frame = J->L->base - 1;
  void *pc = mref(frame_func(frame)->l.pc, void);
  int32_t depth = J->framedepth;
  int32_t count = 0;
  if ((J->pt->flags & PROTO_VARARG)) depth--;  /* Vararg frame still missing. */
  for (; depth > 0; depth--) {  /* Count frames with same prototype. */
    if (frame_iscont(frame)) depth--;
    frame = frame_prev(frame);
    if (mref(frame_func(frame)->l.pc, void) == pc)
      count++;
  }
  if (J->pc == J->startpc) {
    if (count + J->tailcalled > J->param[JIT_P_recunroll]) {
      J->pc++;
      if (J->framedepth + J->retdepth == 0)
	lj_record_stop(J, LJ_TRLINK_TAILREC, J->cur.traceno);  /* Tail-rec. */
      else
	lj_record_stop(J, LJ_TRLINK_UPREC, J->cur.traceno);  /* Up-recursion. */
    }
  } else {
    if (count > J->param[JIT_P_callunroll]) {
      if (lnk) {  /* Possible tail- or up-recursion. */
	lj_trace_flush(J, lnk);  /* Flush trace that only returns. */
	/* Set a small, pseudo-random hotcount for a quick retry of JFUNC*. */
	hotcount_set(J2GG(J), J->pc+1, LJ_PRNG_BITS(J, 4));
      }
      lj_trace_err(J, LJ_TRERR_CUNROLL);
    }
  }
}